

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool google::protobuf::compiler::anon_unknown_0::IsMessageSetWireFormatMessage
               (DescriptorProto *message)

{
  bool bVar1;
  int iVar2;
  MessageOptions *this;
  UninterpretedOption *this_00;
  UninterpretedOption_NamePart *pUVar3;
  string *psVar4;
  UninterpretedOption *uninterpreted;
  int i;
  MessageOptions *options;
  DescriptorProto *message_local;
  
  this = DescriptorProto::options(message);
  uninterpreted._4_4_ = 0;
  do {
    iVar2 = MessageOptions::uninterpreted_option_size(this);
    if (iVar2 <= uninterpreted._4_4_) {
      return false;
    }
    this_00 = MessageOptions::uninterpreted_option(this,uninterpreted._4_4_);
    iVar2 = UninterpretedOption::name_size(this_00);
    if (iVar2 == 1) {
      pUVar3 = UninterpretedOption::name(this_00,0);
      bVar1 = UninterpretedOption_NamePart::is_extension(pUVar3);
      if (!bVar1) {
        pUVar3 = UninterpretedOption::name(this_00,0);
        psVar4 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar3);
        bVar1 = std::operator==(psVar4,"message_set_wire_format");
        if (bVar1) {
          psVar4 = UninterpretedOption::identifier_value_abi_cxx11_(this_00);
          bVar1 = std::operator==(psVar4,"true");
          if (bVar1) {
            return true;
          }
        }
      }
    }
    uninterpreted._4_4_ = uninterpreted._4_4_ + 1;
  } while( true );
}

Assistant:

bool IsMessageSetWireFormatMessage(const DescriptorProto& message) {
  const MessageOptions& options = message.options();
  for (int i = 0; i < options.uninterpreted_option_size(); ++i) {
    const UninterpretedOption& uninterpreted = options.uninterpreted_option(i);
    if (uninterpreted.name_size() == 1 &&
        !uninterpreted.name(0).is_extension() &&
        uninterpreted.name(0).name_part() == "message_set_wire_format" &&
        uninterpreted.identifier_value() == "true") {
      return true;
    }
  }
  return false;
}